

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void floodRoutingTablePacket(void)

{
  pointer pLVar1;
  in_addr_t iVar2;
  Link *link;
  pointer pLVar3;
  packet_t tablePacket;
  sockaddr_in router_address;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  sockaddr local_30;
  
  makeTableIntoPacket_abi_cxx11_();
  pLVar1 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data._M_start
      != links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pLVar3 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      iVar2 = inet_addr((pLVar3->neighbor)._M_dataplus._M_p);
      local_30._0_8_ = (ulong)iVar2 << 0x20 | 0x8b120002;
      local_30.sa_data[6] = '\0';
      local_30.sa_data[7] = '\0';
      local_30.sa_data[8] = '\0';
      local_30.sa_data[9] = '\0';
      local_30.sa_data[10] = '\0';
      local_30.sa_data[0xb] = '\0';
      local_30.sa_data[0xc] = '\0';
      local_30.sa_data[0xd] = '\0';
      sendto(socketLocal.socketFileDescriptor,local_50,local_48,0,&local_30,0x10);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void floodRoutingTablePacket() {
	auto tablePacket = makeTableIntoPacket();
//	for (const auto &neighbor:neighbors) {
//		sockaddr_in router_address = getInetSocketAddress(neighbor.data(), 4747);
//		socketLocal.writeString(router_address, tablePacket);
//	}
	for (const auto &link:links) {
		sockaddr_in router_address = getInetSocketAddress(link.neighbor.data(), 4747);
		socketLocal.writeString(router_address, tablePacket);
	}
}